

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_auto_extension(_func_void *xInit)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  ulong uVar4;
  void *pvVar5;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return iVar2;
  }
  bVar1 = true;
  if ((sqlite3Config.bCoreMutex == '\0') ||
     (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    bVar1 = false;
  }
  uVar4 = 0;
  do {
    if (sqlite3Autoext_0 == uVar4) {
LAB_0011f20f:
      pvVar5 = sqlite3_realloc64(sqlite3Autoext_1,(ulong)(sqlite3Autoext_0 + 1) << 3);
      if (pvVar5 == (void *)0x0) {
        iVar2 = 7;
      }
      else {
        sqlite3Autoext_1 = pvVar5;
        *(_func_void **)((long)pvVar5 + (ulong)sqlite3Autoext_0 * 8) = xInit;
        sqlite3Autoext_0 = sqlite3Autoext_0 + 1;
        iVar2 = 0;
      }
LAB_0011f240:
      if (!bVar1) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      return iVar2;
    }
    if (*(_func_void **)((long)sqlite3Autoext_1 + uVar4 * 8) == xInit) {
      iVar2 = 0;
      if (sqlite3Autoext_0 != (uint)uVar4) goto LAB_0011f240;
      goto LAB_0011f20f;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_auto_extension(
  void (*xInit)(void)
){
  int rc = SQLITE_OK;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( xInit==0 ) return SQLITE_MISUSE_BKPT;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ){
    return rc;
  }else
#endif
  {
    u32 i;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    for(i=0; i<wsdAutoext.nExt; i++){
      if( wsdAutoext.aExt[i]==xInit ) break;
    }
    if( i==wsdAutoext.nExt ){
      u64 nByte = (wsdAutoext.nExt+1)*sizeof(wsdAutoext.aExt[0]);
      void (**aNew)(void);
      aNew = sqlite3_realloc64(wsdAutoext.aExt, nByte);
      if( aNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        wsdAutoext.aExt = aNew;
        wsdAutoext.aExt[wsdAutoext.nExt] = xInit;
        wsdAutoext.nExt++;
      }
    }
    sqlite3_mutex_leave(mutex);
    assert( (rc&0xff)==rc );
    return rc;
  }
}